

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O3

bool __thiscall
Lib::Set<SAT::SATLiteral,_Lib::DefaultHash>::contains
          (Set<SAT::SATLiteral,_Lib::DefaultHash> *this,SATLiteral val)

{
  Cell *pCVar1;
  ulong uVar2;
  uint uVar3;
  Cell *pCVar4;
  uint uVar5;
  size_t i;
  long lVar6;
  anon_union_4_2_6ac8864f_for_SATLiteral_0 local_4;
  
  local_4 = val.field_0;
  uVar3 = 0x811c9dc5;
  lVar6 = 0;
  do {
    uVar3 = (*(byte *)((long)&local_4 + lVar6) ^ uVar3) * 0x1000193;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  uVar5 = 2;
  if (2 < uVar3) {
    uVar5 = uVar3;
  }
  pCVar1 = this->_entries;
  uVar2 = (ulong)uVar5 % (ulong)(uint)this->_capacity;
  uVar3 = pCVar1[uVar2].code;
  if (uVar3 != 0) {
    pCVar4 = pCVar1 + uVar2;
    do {
      if ((uVar3 == uVar5) &&
         ((anon_union_4_2_6ac8864f_for_SATLiteral_0)(pCVar4->value).field_0._content == val.field_0)
         ) {
        return true;
      }
      pCVar4 = pCVar4 + 1;
      if (pCVar4 == this->_afterLast) {
        pCVar4 = pCVar1;
      }
      uVar3 = pCVar4->code;
    } while (uVar3 != 0);
  }
  return false;
}

Assistant:

bool contains (Val val) const
  {
    unsigned code = Hash::hash(val);
    if (code < 2) {
      code = 2;
    }
    for (Cell* cell = firstCellForCode(code);
	 ! cell->empty();
	 cell = nextCell(cell)) {
      if (cell->deleted()) {
	continue;
      }
      if (cell->code == code &&
	  Hash::equals(cell->value,val)) {
	return true;
      }
    }
    return false;
  }